

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_perform(connectdata *conn,_Bool *connected,_Bool *dophase_done)

{
  undefined4 *puVar1;
  bool bVar2;
  int iVar3;
  _Bool selected;
  imap_conn *imapc;
  IMAP *imap;
  SessionHandle *data;
  CURLcode result;
  _Bool *dophase_done_local;
  _Bool *connected_local;
  connectdata *conn_local;
  
  puVar1 = (undefined4 *)(conn->data->req).protop;
  bVar2 = false;
  if (((conn->data->set).opt_no_body & 1U) != 0) {
    *puVar1 = 1;
  }
  *dophase_done = false;
  if ((((*(long *)(puVar1 + 2) != 0) && ((conn->proto).ftpc.prevpath != (char *)0x0)) &&
      (iVar3 = strcmp(*(char **)(puVar1 + 2),(conn->proto).ftpc.prevpath), iVar3 == 0)) &&
     (((*(long *)(puVar1 + 4) == 0 || ((conn->proto).imapc.mailbox_uidvalidity == (char *)0x0)) ||
      (iVar3 = strcmp(*(char **)(puVar1 + 4),(conn->proto).imapc.mailbox_uidvalidity), iVar3 == 0)))
     ) {
    bVar2 = true;
  }
  if (((conn->data->set).upload & 1U) == 0) {
    if ((*(long *)(puVar1 + 0xe) == 0) || ((!bVar2 && (*(long *)(puVar1 + 2) != 0)))) {
      if ((*(long *)(puVar1 + 0xe) == 0) && ((bVar2 && (*(long *)(puVar1 + 6) != 0)))) {
        data._4_4_ = imap_perform_fetch(conn);
      }
      else if ((*(long *)(puVar1 + 0xe) == 0) && ((bVar2 && (*(long *)(puVar1 + 0xc) != 0)))) {
        data._4_4_ = imap_perform_search(conn);
      }
      else if ((*(long *)(puVar1 + 2) == 0) ||
              ((bVar2 || (((*(long *)(puVar1 + 0xe) == 0 && (*(long *)(puVar1 + 6) == 0)) &&
                          (*(long *)(puVar1 + 0xc) == 0)))))) {
        data._4_4_ = imap_perform_list(conn);
      }
      else {
        data._4_4_ = imap_perform_select(conn);
      }
    }
    else {
      data._4_4_ = imap_perform_list(conn);
    }
  }
  else {
    data._4_4_ = imap_perform_append(conn);
  }
  if (data._4_4_ == CURLE_OK) {
    conn_local._4_4_ = imap_multi_statemach(conn,dophase_done);
    *connected = (_Bool)((conn->bits).tcpconnect[0] & 1);
  }
  else {
    conn_local._4_4_ = data._4_4_;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode imap_perform(struct connectdata *conn, bool *connected,
                             bool *dophase_done)
{
  /* This is IMAP and no proxy */
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  struct IMAP *imap = data->req.protop;
  struct imap_conn *imapc = &conn->proto.imapc;
  bool selected = FALSE;

  DEBUGF(infof(conn->data, "DO phase starts\n"));

  if(conn->data->set.opt_no_body) {
    /* Requested no body means no transfer */
    imap->transfer = FTPTRANSFER_INFO;
  }

  *dophase_done = FALSE; /* not done yet */

  /* Determine if the requested mailbox (with the same UIDVALIDITY if set)
     has already been selected on this connection */
  if(imap->mailbox && imapc->mailbox &&
     !strcmp(imap->mailbox, imapc->mailbox) &&
     (!imap->uidvalidity || !imapc->mailbox_uidvalidity ||
      !strcmp(imap->uidvalidity, imapc->mailbox_uidvalidity)))
    selected = TRUE;

  /* Start the first command in the DO phase */
  if(conn->data->set.upload)
    /* APPEND can be executed directly */
    result = imap_perform_append(conn);
  else if(imap->custom && (selected || !imap->mailbox))
    /* Custom command using the same mailbox or no mailbox */
    result = imap_perform_list(conn);
  else if(!imap->custom && selected && imap->uid)
    /* FETCH from the same mailbox */
    result = imap_perform_fetch(conn);
  else if(!imap->custom && selected && imap->query)
    /* SEARCH the current mailbox */
    result = imap_perform_search(conn);
  else if(imap->mailbox && !selected &&
         (imap->custom || imap->uid || imap->query))
    /* SELECT the mailbox */
    result = imap_perform_select(conn);
  else
    /* LIST */
    result = imap_perform_list(conn);

  if(result)
    return result;

  /* Run the state-machine */
  result = imap_multi_statemach(conn, dophase_done);

  *connected = conn->bits.tcpconnect[FIRSTSOCKET];

  if(*dophase_done)
    DEBUGF(infof(conn->data, "DO phase is complete\n"));

  return result;
}